

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void jsondec_wellknown(jsondec *d,upb_Message *msg,upb_MessageDef *m)

{
  _Bool _Var1;
  upb_WellKnown uVar2;
  upb_MessageDef *m_local;
  upb_Message *msg_local;
  jsondec *d_local;
  
  _Var1 = upb_Message_IsFrozen(msg);
  if (!_Var1) {
    uVar2 = upb_MessageDef_WellKnownType(m);
    switch(uVar2) {
    case kUpb_WellKnown_Any:
      jsondec_any(d,msg,m);
      break;
    case kUpb_WellKnown_FieldMask:
      jsondec_fieldmask(d,msg,m);
      break;
    case kUpb_WellKnown_Duration:
      jsondec_duration(d,msg,m);
      break;
    case kUpb_WellKnown_Timestamp:
      jsondec_timestamp(d,msg,m);
      break;
    case kUpb_WellKnown_DoubleValue:
    case kUpb_WellKnown_FloatValue:
    case kUpb_WellKnown_Int64Value:
    case kUpb_WellKnown_UInt64Value:
    case kUpb_WellKnown_Int32Value:
    case kUpb_WellKnown_UInt32Value:
    case kUpb_WellKnown_StringValue:
    case kUpb_WellKnown_BytesValue:
    case kUpb_WellKnown_BoolValue:
      jsondec_wrapper(d,msg,m);
      break;
    case kUpb_WellKnown_Value:
      jsondec_wellknownvalue(d,msg,m);
      break;
    case kUpb_WellKnown_ListValue:
      jsondec_listvalue(d,msg,m);
      break;
    case kUpb_WellKnown_Struct:
      jsondec_struct(d,msg,m);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                    ,0x5f9,
                    "void jsondec_wellknown(jsondec *, upb_Message *, const upb_MessageDef *)");
    }
    return;
  }
  __assert_fail("!upb_Message_IsFrozen(msg)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/json/decode.c"
                ,0x5d6,"void jsondec_wellknown(jsondec *, upb_Message *, const upb_MessageDef *)");
}

Assistant:

static void jsondec_wellknown(jsondec* d, upb_Message* msg,
                              const upb_MessageDef* m) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  switch (upb_MessageDef_WellKnownType(m)) {
    case kUpb_WellKnown_Any:
      jsondec_any(d, msg, m);
      break;
    case kUpb_WellKnown_FieldMask:
      jsondec_fieldmask(d, msg, m);
      break;
    case kUpb_WellKnown_Duration:
      jsondec_duration(d, msg, m);
      break;
    case kUpb_WellKnown_Timestamp:
      jsondec_timestamp(d, msg, m);
      break;
    case kUpb_WellKnown_Value:
      jsondec_wellknownvalue(d, msg, m);
      break;
    case kUpb_WellKnown_ListValue:
      jsondec_listvalue(d, msg, m);
      break;
    case kUpb_WellKnown_Struct:
      jsondec_struct(d, msg, m);
      break;
    case kUpb_WellKnown_DoubleValue:
    case kUpb_WellKnown_FloatValue:
    case kUpb_WellKnown_Int64Value:
    case kUpb_WellKnown_UInt64Value:
    case kUpb_WellKnown_Int32Value:
    case kUpb_WellKnown_UInt32Value:
    case kUpb_WellKnown_StringValue:
    case kUpb_WellKnown_BytesValue:
    case kUpb_WellKnown_BoolValue:
      jsondec_wrapper(d, msg, m);
      break;
    default:
      UPB_UNREACHABLE();
  }
}